

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

void socket_cb(uv_poll_t *poll,int status,int events)

{
  ssize_t sVar1;
  char *pcVar2;
  undefined8 uStack_20;
  
  socket_cb_called = socket_cb_called + 1;
  if (status == 0) {
    printf("Socket cb got events %d\n");
    if ((events & 1U) != 0) {
      if (socket_cb_read_fd != 0) {
        sVar1 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
        if (sVar1 != (ulong)socket_cb_read_size * 3) {
          pcVar2 = "cnt == socket_cb_read_size";
          uStack_20 = 0x37;
          goto LAB_001161ac;
        }
      }
      uv_close((uv_handle_t *)poll,(uv_close_cb)0x0);
      return;
    }
    pcVar2 = "UV_READABLE == (events & UV_READABLE)";
    uStack_20 = 0x34;
  }
  else {
    pcVar2 = "0 == status";
    uStack_20 = 0x32;
  }
LAB_001161ac:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fork.c",
          uStack_20,pcVar2);
  abort();
}

Assistant:

static void socket_cb(uv_poll_t* poll, int status, int events) {
  ssize_t cnt;
  socket_cb_called++;
  ASSERT(0 == status);
  printf("Socket cb got events %d\n", events);
  ASSERT(UV_READABLE == (events & UV_READABLE));
  if (socket_cb_read_fd) {
    cnt = read(socket_cb_read_fd, socket_cb_read_buf, socket_cb_read_size);
    ASSERT(cnt == socket_cb_read_size);
  }
  uv_close((uv_handle_t*) poll, NULL);
}